

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::PointwiseMatcher<iutest::detail::TwofoldGeMatcher,_int[3]>::PointwiseMatcher
          (PointwiseMatcher<iutest::detail::TwofoldGeMatcher,_int[3]> *this,
          TwofoldGeMatcher *matcher,int (*expected) [3])

{
  int (*expected_local) [3];
  TwofoldGeMatcher *matcher_local;
  PointwiseMatcher<iutest::detail::TwofoldGeMatcher,_int[3]> *this_local;
  
  IMatcher::IMatcher(&this->super_IMatcher);
  (this->super_IMatcher)._vptr_IMatcher = (_func_int **)&PTR__PointwiseMatcher_003370b8;
  TwofoldGeMatcher::TwofoldGeMatcher(&this->m_matcher,matcher);
  this->m_expected = expected;
  std::__cxx11::string::string((string *)&this->m_whichIs);
  return;
}

Assistant:

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }